

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

xmlNodePtr nodePop(xmlParserCtxtPtr ctxt)

{
  xmlNodePtr ret;
  xmlParserCtxtPtr ctxt_local;
  
  if (ctxt == (xmlParserCtxtPtr)0x0) {
    ctxt_local = (xmlParserCtxtPtr)0x0;
  }
  else if (ctxt->nodeNr < 1) {
    ctxt_local = (xmlParserCtxtPtr)0x0;
  }
  else {
    ctxt->nodeNr = ctxt->nodeNr + -1;
    if (ctxt->nodeNr < 1) {
      ctxt->node = (xmlNodePtr)0x0;
    }
    else {
      ctxt->node = ctxt->nodeTab[ctxt->nodeNr + -1];
    }
    ctxt_local = (xmlParserCtxtPtr)ctxt->nodeTab[ctxt->nodeNr];
    ctxt->nodeTab[ctxt->nodeNr] = (xmlNodePtr)0x0;
  }
  return (xmlNodePtr)ctxt_local;
}

Assistant:

xmlNodePtr
nodePop(xmlParserCtxtPtr ctxt)
{
    xmlNodePtr ret;

    if (ctxt == NULL) return(NULL);
    if (ctxt->nodeNr <= 0)
        return (NULL);
    ctxt->nodeNr--;
    if (ctxt->nodeNr > 0)
        ctxt->node = ctxt->nodeTab[ctxt->nodeNr - 1];
    else
        ctxt->node = NULL;
    ret = ctxt->nodeTab[ctxt->nodeNr];
    ctxt->nodeTab[ctxt->nodeNr] = NULL;
    return (ret);
}